

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O2

pool_ptr<soul::heart::Function> __thiscall
soul::heart::Parser::findFunction(Parser *this,string *name,ArrayView<soul::Type> argTypes)

{
  long *plVar1;
  long lVar2;
  bool bVar3;
  __type_conflict1 _Var4;
  string *child;
  Module *pMVar5;
  Function *fn_00;
  Function *pFVar6;
  string *s;
  pool_ref<soul::heart::Function> *fn;
  pool_ref<soul::heart::Function> *ppVar7;
  Type *in_R8;
  long *plVar8;
  long lVar9;
  Function *pFVar10;
  string_view other;
  ArrayView<soul::Type> argTypes_00;
  ArrayView<soul::Type> argTypes_01;
  string local_50;
  
  fn_00 = (Function *)argTypes.e;
  s = (string *)argTypes.s;
  pFVar6 = fn_00;
  bVar3 = containsChar(s,':');
  if (bVar3) {
    lVar9 = *(long *)((long)&name[3].field_2 + 8);
    plVar1 = *(long **)(lVar9 + 0x48);
    for (plVar8 = *(long **)(lVar9 + 0x40); plVar8 != plVar1; plVar8 = plVar8 + 1) {
      ppVar7 = *(pool_ref<soul::heart::Function> **)(*plVar8 + 0x130);
      for (lVar9 = *(long *)(*plVar8 + 0x138) << 3; lVar9 != 0; lVar9 = lVar9 + -8) {
        lVar2 = *plVar8;
        child = Identifier::operator_cast_to_string_(&ppVar7->object->name);
        TokenisedPathString::join(&local_50,(string *)(lVar2 + 0x30),child);
        _Var4 = std::operator==(&local_50,s);
        if (_Var4) {
          argTypes_00.e = (Type *)pFVar6;
          argTypes_00.s = in_R8;
          bVar3 = functionArgTypesMatch((Parser *)ppVar7->object,fn_00,argTypes_00);
          std::__cxx11::string::~string((string *)&local_50);
          if (bVar3) goto LAB_0027a441;
        }
        else {
          std::__cxx11::string::~string((string *)&local_50);
        }
        ppVar7 = ppVar7 + 1;
      }
    }
    pFVar10 = (Function *)0x0;
  }
  else {
    pMVar5 = pool_ptr<soul::Module>::operator->((pool_ptr<soul::Module> *)&name[4]._M_string_length)
    ;
    ppVar7 = (pMVar5->functions).functions.items;
    pFVar10 = (Function *)0x0;
    for (lVar9 = (pMVar5->functions).functions.numActive << 3; lVar9 != 0; lVar9 = lVar9 + -8) {
      other._M_str = (s->_M_dataplus)._M_p;
      other._M_len = s->_M_string_length;
      bVar3 = Identifier::operator==(&ppVar7->object->name,other);
      if ((bVar3) &&
         (argTypes_01.e = (Type *)pFVar6, argTypes_01.s = in_R8,
         bVar3 = functionArgTypesMatch((Parser *)ppVar7->object,fn_00,argTypes_01), bVar3))
      goto LAB_0027a441;
      ppVar7 = ppVar7 + 1;
    }
  }
LAB_0027a449:
  (this->
  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>)
  ._vptr_Tokeniser = (_func_int **)pFVar10;
  return (pool_ptr<soul::heart::Function>)this;
LAB_0027a441:
  pFVar10 = ppVar7->object;
  goto LAB_0027a449;
}

Assistant:

pool_ptr<heart::Function> findFunction (const std::string& name, ArrayView<Type> argTypes)
    {
        if (! containsChar (name, ':'))
        {
            for (auto& fn : module->functions.get())
                if (fn->name == name && functionArgTypesMatch (fn, argTypes))
                    return fn;
        }
        else
        {
            for (auto& m : program.getModules())
                for (auto& fn : m->functions.get())
                    if (TokenisedPathString::join (m->fullName, fn->name) == name && functionArgTypesMatch (fn, argTypes))
                        return fn;
        }

        return {};
    }